

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O3

void __thiscall
Js::RecyclableCollectionObjectWalker<Js::JavascriptMap>::GetChildren
          (RecyclableCollectionObjectWalker<Js::JavascriptMap> *this)

{
  Type *addr;
  int iVar1;
  MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
  *pMVar2;
  List<Js::RecyclableCollectionObjectWalkerPropertyData<Js::JavascriptMap>,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  Type pRVar3;
  Type TVar4;
  Type TVar5;
  bool bVar6;
  undefined1 local_48 [8];
  Iterator iterator;
  
  VarTo<Js::JavascriptMap>(this->instance);
  JavascriptMap::GetIterator((JavascriptMap *)local_48);
  bVar6 = MapOrSetDataList<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
          ::Iterator::Next((Iterator *)local_48);
  if (bVar6) {
    addr = &iterator.current;
    do {
      pMVar2 = iterator.list.ptr[1].first.ptr;
      Memory::Recycler::WBSetBit((char *)addr);
      iterator.current.ptr = pMVar2;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
      TVar4.ptr = iterator.current.ptr;
      pMVar2 = iterator.list.ptr[1].last.ptr;
      Memory::Recycler::WBSetBit((char *)addr);
      iterator.current.ptr = pMVar2;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
      TVar5.ptr = iterator.current.ptr;
      this_00 = this->propertyList;
      JsUtil::
      List<Js::RecyclableCollectionObjectWalkerPropertyData<Js::JavascriptMap>,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
      ::EnsureArray(this_00,0);
      pRVar3 = (this_00->
               super_ReadOnlyList<Js::RecyclableCollectionObjectWalkerPropertyData<Js::JavascriptMap>,_Memory::ArenaAllocator,_DefaultComparer>
               ).buffer;
      iVar1 = (this_00->
              super_ReadOnlyList<Js::RecyclableCollectionObjectWalkerPropertyData<Js::JavascriptMap>,_Memory::ArenaAllocator,_DefaultComparer>
              ).count;
      pRVar3[iVar1].key = TVar4.ptr;
      pRVar3[iVar1].value = TVar5.ptr;
      (this_00->
      super_ReadOnlyList<Js::RecyclableCollectionObjectWalkerPropertyData<Js::JavascriptMap>,_Memory::ArenaAllocator,_DefaultComparer>
      ).count = iVar1 + 1;
      bVar6 = MapOrSetDataList<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
              ::Iterator::Next((Iterator *)local_48);
    } while (bVar6);
  }
  return;
}

Assistant:

void RecyclableCollectionObjectWalker<JavascriptMap>::GetChildren()
    {
        JavascriptMap* data = VarTo<JavascriptMap>(instance);
        auto iterator = data->GetIterator();
        while (iterator.Next())
        {
            Var key = iterator.Current().Key();
            Var value = iterator.Current().Value();
            propertyList->Add(RecyclableCollectionObjectWalkerPropertyData<JavascriptMap>(key, value));
        }
    }